

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

ExtensionRangeOptions * __thiscall
google::protobuf::DescriptorProto_ExtensionRange::_internal_mutable_options
          (DescriptorProto_ExtensionRange *this)

{
  ExtensionRangeOptions *pEVar1;
  Arena *arena;
  
  pEVar1 = (this->field_0)._impl_.options_;
  if (pEVar1 != (ExtensionRangeOptions *)0x0) {
    return pEVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pEVar1 = (ExtensionRangeOptions *)
           Arena::DefaultConstruct<google::protobuf::ExtensionRangeOptions>(arena);
  (this->field_0)._impl_.options_ = pEVar1;
  return pEVar1;
}

Assistant:

inline ::google::protobuf::ExtensionRangeOptions* PROTOBUF_NONNULL DescriptorProto_ExtensionRange::_internal_mutable_options() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.options_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::google::protobuf::ExtensionRangeOptions>(GetArena());
    _impl_.options_ = reinterpret_cast<::google::protobuf::ExtensionRangeOptions*>(p);
  }
  return _impl_.options_;
}